

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformFloat
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program,string *name)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLint location;
  GLfloat floatVar;
  string local_1c8;
  undefined1 local_1a8 [384];
  
  this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
  location = glu::CallLogWrapper::glGetUniformLocation
                       (this_00,(program->m_program).m_program,(name->_M_dataplus)._M_p);
  floatVar = -1.0;
  glu::CallLogWrapper::glGetUniformfv(this_00,(program->m_program).m_program,location,&floatVar);
  if ((floatVar != 0.0) || (NAN(floatVar))) {
    local_1a8._0_8_ =
         ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"Fail, expected zero value for ");
    std::operator<<((ostream *)this_01,(string *)name);
    std::operator<<((ostream *)this_01,", received: ");
    de::toString<float>(&local_1c8,&floatVar);
    std::operator<<((ostream *)this_01,(string *)&local_1c8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Uniform value not reset");
  }
  return;
}

Assistant:

void verifyUniformFloat (glu::ShaderProgram& program, const std::string& name)
	{
		const GLint	floatLoc	= glGetUniformLocation(program.getProgram(), name.c_str());
		GLfloat		floatVar	= -1;

		glGetUniformfv(program.getProgram(), floatLoc, &floatVar);

		if (floatVar != 0.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Fail, expected zero value for " << name << ", received: " << de::toString(floatVar) << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Uniform value not reset");
		}
	}